

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs5.c
# Opt level: O0

int mbedtls_pkcs5_self_test(int verbose)

{
  int iVar1;
  mbedtls_md_info_t *md_info;
  uchar local_78 [8];
  uchar key [64];
  int i;
  int ret;
  mbedtls_md_info_t *info_sha1;
  mbedtls_md_context_t sha1_ctx;
  int verbose_local;
  
  sha1_ctx.hmac_ctx._4_4_ = verbose;
  mbedtls_md_init((mbedtls_md_context_t *)&info_sha1);
  md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA1);
  if (md_info == (mbedtls_md_info_t *)0x0) {
    key[0x3c] = '\x01';
    key[0x3d] = '\0';
    key[0x3e] = '\0';
    key[0x3f] = '\0';
  }
  else {
    iVar1 = mbedtls_md_setup((mbedtls_md_context_t *)&info_sha1,md_info,1);
    if (iVar1 == 0) {
      key[0x38] = '\0';
      key[0x39] = '\0';
      key[0x3a] = '\0';
      key[0x3b] = '\0';
      key[0x3c] = '\0';
      key[0x3d] = '\0';
      key[0x3e] = '\0';
      key[0x3f] = '\0';
      for (; (int)key._56_4_ < 6; key._56_4_ = key._56_4_ + 1) {
        if (sha1_ctx.hmac_ctx._4_4_ != 0) {
          printf("  PBKDF2 (SHA1) #%d: ",(ulong)(uint)key._56_4_);
        }
        key._60_4_ = mbedtls_pkcs5_pbkdf2_hmac
                               ((mbedtls_md_context_t *)&info_sha1,
                                password_test_data[(int)key._56_4_],plen_test_data[(int)key._56_4_],
                                salt_test_data[(int)key._56_4_],slen_test_data[(int)key._56_4_],
                                it_cnt_test_data[(int)key._56_4_],key_len_test_data[(int)key._56_4_]
                                ,local_78);
        if ((key._60_4_ != 0) ||
           (iVar1 = memcmp(result_key_test_data + (int)key._56_4_,local_78,
                           (ulong)key_len_test_data[(int)key._56_4_]), iVar1 != 0)) {
          if (sha1_ctx.hmac_ctx._4_4_ != 0) {
            printf("failed\n");
          }
          key[0x3c] = '\x01';
          key[0x3d] = '\0';
          key[0x3e] = '\0';
          key[0x3f] = '\0';
          goto LAB_0013a7cc;
        }
        if (sha1_ctx.hmac_ctx._4_4_ != 0) {
          printf("passed\n");
        }
      }
      if (sha1_ctx.hmac_ctx._4_4_ != 0) {
        printf(anon_var_dwarf_f85c + 8);
      }
    }
    else {
      key[0x3c] = '\x01';
      key[0x3d] = '\0';
      key[0x3e] = '\0';
      key[0x3f] = '\0';
    }
  }
LAB_0013a7cc:
  mbedtls_md_free((mbedtls_md_context_t *)&info_sha1);
  iVar1._0_1_ = key[0x3c];
  iVar1._1_1_ = key[0x3d];
  iVar1._2_1_ = key[0x3e];
  iVar1._3_1_ = key[0x3f];
  return iVar1;
}

Assistant:

int mbedtls_pkcs5_self_test( int verbose )
{
    mbedtls_md_context_t sha1_ctx;
    const mbedtls_md_info_t *info_sha1;
    int ret, i;
    unsigned char key[64];

    mbedtls_md_init( &sha1_ctx );

    info_sha1 = mbedtls_md_info_from_type( MBEDTLS_MD_SHA1 );
    if( info_sha1 == NULL )
    {
        ret = 1;
        goto exit;
    }

    if( ( ret = mbedtls_md_setup( &sha1_ctx, info_sha1, 1 ) ) != 0 )
    {
        ret = 1;
        goto exit;
    }

    for( i = 0; i < MAX_TESTS; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  PBKDF2 (SHA1) #%d: ", i );

        ret = mbedtls_pkcs5_pbkdf2_hmac( &sha1_ctx, password_test_data[i],
                                         plen_test_data[i], salt_test_data[i],
                                         slen_test_data[i], it_cnt_test_data[i],
                                         key_len_test_data[i], key );
        if( ret != 0 ||
            memcmp( result_key_test_data[i], key, key_len_test_data[i] ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_md_free( &sha1_ctx );

    return( ret );
}